

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_c.cpp
# Opt level: O0

spvc_result
spvc_resources_get_builtin_resource_list_for_type
          (spvc_resources resources,spvc_builtin_resource_type type,
          spvc_reflected_builtin_resource **resource_list,size_t *resource_size)

{
  spvc_context_s *this;
  spvc_reflected_builtin_resource *psVar1;
  allocator local_59;
  string local_58;
  VectorView<spvc_reflected_builtin_resource> *local_38;
  SmallVector<spvc_reflected_builtin_resource,_8UL> *list;
  size_t *resource_size_local;
  spvc_reflected_builtin_resource **resource_list_local;
  spvc_resources psStack_18;
  spvc_builtin_resource_type type_local;
  spvc_resources resources_local;
  
  local_38 = (VectorView<spvc_reflected_builtin_resource> *)0x0;
  if (type == SPVC_BUILTIN_RESOURCE_TYPE_STAGE_INPUT) {
    local_38 = &(resources->builtin_inputs).super_VectorView<spvc_reflected_builtin_resource>;
  }
  else if (type == SPVC_BUILTIN_RESOURCE_TYPE_STAGE_OUTPUT) {
    local_38 = &(resources->builtin_outputs).super_VectorView<spvc_reflected_builtin_resource>;
  }
  list = (SmallVector<spvc_reflected_builtin_resource,_8UL> *)resource_size;
  resource_size_local = (size_t *)resource_list;
  resource_list_local._4_4_ = type;
  psStack_18 = resources;
  if (local_38 == (VectorView<spvc_reflected_builtin_resource> *)0x0) {
    this = resources->context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_58,"Invalid argument.",&local_59);
    spvc_context_s::report_error(this,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    std::allocator<char>::~allocator((allocator<char> *)&local_59);
    resources_local._4_4_ = SPVC_ERROR_INVALID_ARGUMENT;
  }
  else {
    psVar1 = (spvc_reflected_builtin_resource *)
             spirv_cross::VectorView<spvc_reflected_builtin_resource>::size(local_38);
    (list->super_VectorView<spvc_reflected_builtin_resource>).ptr = psVar1;
    psVar1 = spirv_cross::VectorView<spvc_reflected_builtin_resource>::data(local_38);
    *resource_size_local = (size_t)psVar1;
    resources_local._4_4_ = SPVC_SUCCESS;
  }
  return resources_local._4_4_;
}

Assistant:

spvc_result spvc_resources_get_builtin_resource_list_for_type(
		spvc_resources resources, spvc_builtin_resource_type type,
		const spvc_reflected_builtin_resource **resource_list,
		size_t *resource_size)
{
	const SmallVector<spvc_reflected_builtin_resource> *list = nullptr;
	switch (type)
	{
	case SPVC_BUILTIN_RESOURCE_TYPE_STAGE_INPUT:
		list = &resources->builtin_inputs;
		break;

	case SPVC_BUILTIN_RESOURCE_TYPE_STAGE_OUTPUT:
		list = &resources->builtin_outputs;
		break;

	default:
		break;
	}

	if (!list)
	{
		resources->context->report_error("Invalid argument.");
		return SPVC_ERROR_INVALID_ARGUMENT;
	}

	*resource_size = list->size();
	*resource_list = list->data();
	return SPVC_SUCCESS;
}